

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDitheringTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles3::Functional::DitheringCase::checkColor
          (DitheringCase *this,Vec4 *inputClr,RGBA *renderedClr,bool logErrors)

{
  deUint32 dVar1;
  ostringstream *poVar2;
  int iVar3;
  char *__s;
  long lVar4;
  pointer piVar5;
  pointer piVar6;
  bool bVar7;
  deUint32 dVar8;
  ulong uVar9;
  size_t sVar10;
  undefined7 in_register_00000009;
  deUint32 dVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  ostringstream *this_00;
  uint uVar16;
  float __x;
  float fVar17;
  vector<int,_std::allocator<int>_> channelChoices;
  vector<int,_std::allocator<int>_> local_548;
  Vec4 *local_528;
  char *local_520;
  long local_518;
  char local_510;
  undefined7 uStack_50f;
  undefined4 local_500;
  float local_4fc;
  DitheringCase *local_4f8;
  long *local_4f0;
  long local_4e0 [2];
  RGBA *local_4d0;
  undefined1 local_4c8 [16];
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined1 local_4a8 [120];
  ios_base local_430 [264];
  undefined1 local_328 [120];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_500 = (undefined4)CONCAT71(in_register_00000009,logErrors);
  local_4b8._0_4_ = (this->m_renderFormat).redBits;
  local_4b8._4_4_ = (this->m_renderFormat).greenBits;
  uStack_4b0._0_4_ = (this->m_renderFormat).blueBits;
  uStack_4b0._4_4_ = (this->m_renderFormat).alphaBits;
  bVar7 = true;
  lVar14 = 0;
  local_528 = inputClr;
  local_4f8 = this;
  local_4d0 = renderedClr;
  do {
    iVar3 = *(int *)((long)&local_4b8 + lVar14 * 4);
    if (iVar3 != 0) {
      iVar15 = 1 << ((byte)iVar3 & 0x1f);
      dVar1 = iVar15 - 1;
      __x = (float)(int)dVar1 * local_528->m_data[lVar14];
      local_4fc = floorf(__x + 0.5);
      local_548.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (int *)0x0;
      local_548.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (int *)0x0;
      local_548.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (int *)0x0;
      fVar17 = ceilf(__x);
      dVar11 = (deUint32)fVar17;
      dVar8 = dVar11;
      if ((int)dVar1 < (int)dVar11) {
        dVar8 = dVar1;
      }
      local_4a8._0_4_ = dVar8;
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_548,(iterator)0x0,(int *)local_4a8);
      local_4a8._0_4_ = dVar11 - 1;
      if ((int)local_4a8._0_4_ < 1) {
        local_4a8._0_4_ = 0;
      }
      if (local_548.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_548.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_548,
                   (iterator)
                   local_548.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)local_4a8);
      }
      else {
        *local_548.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_4a8._0_4_;
        local_548.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_548.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      fVar17 = __x - local_4fc;
      uVar16 = -(uint)(-fVar17 <= fVar17);
      fVar17 = (float)(~uVar16 & (uint)-fVar17 | (uint)fVar17 & uVar16);
      local_4c8 = ZEXT416((uint)fVar17);
      if (fVar17 < 0.0001) {
        if (__x <= local_4fc) {
          iVar12 = dVar11 + 1;
          local_4a8._0_4_ = iVar12;
          if (local_548.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_548.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) goto LAB_0121589b;
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_548,
                     (iterator)
                     local_548.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)local_4a8);
        }
        else {
          iVar12 = dVar11 - 2;
          local_4a8._0_4_ = iVar12;
          if (local_548.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_548.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_548,
                       (iterator)
                       local_548.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)local_4a8);
          }
          else {
LAB_0121589b:
            *local_548.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish = iVar12;
            local_548.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_548.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
        }
      }
      piVar6 = local_548.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      piVar5 = local_548.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (local_548.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          local_548.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        uVar9 = (long)local_548.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_548.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2;
        lVar4 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar4 == 0; lVar4 = lVar4 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_548.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_548.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (piVar5,piVar6);
      }
      tcu::RGBA::toIVec((RGBA *)local_4a8);
      fVar17 = floorf((float)(int)(dVar1 * *(int *)(local_4a8 + lVar14 * 4)) / 255.0 + 0.5);
      uVar16 = (uint)((ulong)((long)local_548.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)local_548.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 2);
      if (0 < (int)uVar16) {
        uVar9 = 0;
        do {
          if (local_548.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar9] == (int)fVar17) goto LAB_01215cf7;
          uVar9 = uVar9 + 1;
        } while ((uVar16 & 0x7fffffff) != uVar9);
      }
      if ((char)local_500 != '\0') {
        local_328._0_8_ = ((local_4f8->super_TestCase).super_TestNode.m_testCtx)->m_log;
        poVar2 = (ostringstream *)(local_328 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Failure: ",9);
        std::ostream::operator<<(poVar2,iVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"-bit ",5);
        __s = (char *)(&s_channelNames)[lVar14];
        sVar10 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,__s,sVar10);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," channel is ",0xc);
        std::ostream::operator<<(poVar2,(int)fVar17);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,", should be ",0xc);
        local_520 = &local_510;
        local_518 = 0;
        local_510 = '\0';
        uVar9 = (ulong)((long)local_548.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)local_548.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2;
        if (0 < (int)uVar9) {
          uVar13 = 0;
          do {
            if ((uVar13 == (int)uVar9 - 1) || (uVar13 != 0)) {
              std::__cxx11::string::append((char *)&local_520);
            }
            piVar5 = local_548.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            std::__cxx11::ostringstream::ostringstream(local_1a8);
            std::ostream::operator<<(local_1a8,piVar5[uVar13]);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream(local_1a8);
            std::ios_base::~ios_base(local_138);
            std::__cxx11::string::_M_append((char *)&local_520,(ulong)local_4f0);
            if (local_4f0 != local_4e0) {
              operator_delete(local_4f0,local_4e0[0] + 1);
            }
            uVar13 = uVar13 + 1;
            uVar9 = (ulong)((long)local_548.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)local_548.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 2;
          } while ((long)uVar13 < (long)(int)uVar9);
        }
        this_00 = (ostringstream *)(local_328 + 8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,local_520,local_518);
        poVar2 = (ostringstream *)(local_4a8 + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00," (corresponding fragment color channel is ",0x2a);
        std::ostream::_M_insert<double>((double)local_528->m_data[lVar14]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
        local_4a8._0_8_ =
             tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Note: ",6);
        std::ostream::_M_insert<double>((double)local_528->m_data[lVar14]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," * (",4);
        std::ostream::operator<<(poVar2,iVar15);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"-1) = ",6);
        std::ostream::_M_insert<double>((double)__x);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar2);
        std::ios_base::~ios_base(local_430);
        if (local_520 != &local_510) {
          operator_delete(local_520,CONCAT71(uStack_50f,local_510) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_2b0);
        if ((float)local_4c8._0_4_ < 0.0001) {
          local_4a8._0_8_ = ((local_4f8->super_TestCase).super_TestNode.m_testCtx)->m_log;
          poVar2 = (ostringstream *)(local_4a8 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,
                     "Note: one extra color candidate was allowed because fragmentColorChannel * (2^bits-1) is close to an integer"
                     ,0x6c);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar2);
          std::ios_base::~ios_base(local_430);
        }
      }
      bVar7 = false;
LAB_01215cf7:
      if (local_548.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_548.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_548.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_548.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    lVar14 = lVar14 + 1;
    if (lVar14 == 4) {
      return bVar7;
    }
  } while( true );
}

Assistant:

bool DitheringCase::checkColor (const Vec4& inputClr, const tcu::RGBA& renderedClr, const bool logErrors) const
{
	const IVec4		channelBits		= pixelFormatToIVec4(m_renderFormat);
	bool			allChannelsOk	= true;

	for (int chanNdx = 0; chanNdx < 4; chanNdx++)
	{
		if (channelBits[chanNdx] == 0)
			continue;

		const int		channelMax			= (1 << channelBits[chanNdx]) - 1;
		const float		scaledInput			= inputClr[chanNdx] * (float)channelMax;
		const bool		useRoundingMargin	= deFloatAbs(scaledInput - deFloatRound(scaledInput)) < 0.0001f;
		vector<int>		channelChoices;

		channelChoices.push_back(de::min(channelMax,	(int)deFloatCeil(scaledInput)));
		channelChoices.push_back(de::max(0,				(int)deFloatCeil(scaledInput) - 1));

		// If the input color results in a scaled value that is very close to an integer, account for a little bit of possible inaccuracy.
		if (useRoundingMargin)
		{
			if (scaledInput > deFloatRound(scaledInput))
				channelChoices.push_back((int)deFloatCeil(scaledInput) - 2);
			else
				channelChoices.push_back((int)deFloatCeil(scaledInput) + 1);
		}

		std::sort(channelChoices.begin(), channelChoices.end());

		{
			const int		renderedClrInFormat	= (int)deFloatRound((float)(renderedClr.toIVec()[chanNdx] * channelMax) / 255.0f);
			bool			goodChannel			= false;

			for (int i = 0; i < (int)channelChoices.size(); i++)
			{
				if (renderedClrInFormat == channelChoices[i])
				{
					goodChannel = true;
					break;
				}
			}

			if (!goodChannel)
			{
				if (logErrors)
				{
					m_testCtx.getLog() << TestLog::Message
									   << "Failure: " << channelBits[chanNdx] << "-bit " << s_channelNames[chanNdx] << " channel is " << renderedClrInFormat
									   << ", should be " << choiceListStr(channelChoices)
									   << " (corresponding fragment color channel is " << inputClr[chanNdx] << ")"
									   << TestLog::EndMessage
									   << TestLog::Message
									   << "Note: " << inputClr[chanNdx] << " * (" << channelMax + 1 << "-1) = " << scaledInput
									   << TestLog::EndMessage;

					if (useRoundingMargin)
					{
						m_testCtx.getLog() << TestLog::Message
										   << "Note: one extra color candidate was allowed because fragmentColorChannel * (2^bits-1) is close to an integer"
										   << TestLog::EndMessage;
					}
				}

				allChannelsOk = false;
			}
		}
	}

	return allChannelsOk;
}